

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thermalizer.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  size_type sVar3;
  size_type sVar4;
  int iVar5;
  SimInfo *info;
  Velocitizer *this;
  ForceManager *this_00;
  DumpWriter *this_01;
  char *pcVar6;
  Thermo thermo;
  string outputFileName;
  string inputFileName;
  SimCreator creator;
  gengetopt_args_info args_info;
  double local_168;
  Thermo local_160;
  RealType local_158;
  string local_150;
  string local_130;
  SimCreator local_110;
  gengetopt_args_info local_e8;
  
  local_130._M_string_length = 0;
  local_130.field_2._M_local_buf[0] = '\0';
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  local_150._M_string_length = 0;
  local_150.field_2._M_local_buf[0] = '\0';
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  iVar5 = cmdline_parser(argc,argv,&local_e8);
  sVar3 = local_130._M_string_length;
  if (iVar5 != 0) {
    cmdline_parser_print_help();
    exit(1);
  }
  if (local_e8.input_given == 0) {
    if (local_e8.inputs_num != 0) goto LAB_0011e3de;
    builtin_strncpy(painCave.errMsg,"No input file name was specified on the command line",0x35);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  else {
    local_e8.inputs = &local_e8.input_arg;
LAB_0011e3de:
    pcVar6 = *local_e8.inputs;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&local_130,0,(char *)sVar3,(ulong)pcVar6);
  }
  sVar3 = local_150._M_string_length;
  strlen(local_e8.output_arg);
  std::__cxx11::string::_M_replace((ulong)&local_150,0,(char *)sVar3,(ulong)local_e8.output_arg);
  sVar4 = local_130._M_string_length;
  sVar3 = local_150._M_string_length;
  pcVar6 = (char *)local_150._M_string_length;
  if (local_130._M_string_length < local_150._M_string_length) {
    pcVar6 = (char *)local_130._M_string_length;
  }
  if (pcVar6 == (char *)0x0) {
    if (local_150._M_string_length != local_130._M_string_length) goto LAB_0011e4ac;
  }
  else {
    iVar5 = bcmp(local_150._M_dataplus._M_p,local_130._M_dataplus._M_p,(size_t)pcVar6);
    if ((sVar3 != sVar4) || (iVar5 != 0)) goto LAB_0011e4ac;
  }
  builtin_strncpy(painCave.errMsg,"Input and Output File names should be different!",0x31);
  painCave.isFatal = 1;
  painCave.severity = 1;
  simError();
LAB_0011e4ac:
  paVar1 = &local_110.mdFileName_.field_2;
  local_110._vptr_SimCreator = (_func_int **)&PTR__SimCreator_002a7fe0;
  local_110.mdFileName_._M_string_length = 0;
  local_110.mdFileName_.field_2._M_local_buf[0] = '\0';
  local_110.mdFileName_._M_dataplus._M_p = (pointer)paVar1;
  info = OpenMD::SimCreator::createSim(&local_110,&local_130,true);
  local_160.info_ = info;
  this = (Velocitizer *)operator_new(0x30);
  OpenMD::Velocitizer::Velocitizer(this,info);
  this_00 = (ForceManager *)operator_new(0xc80);
  OpenMD::ForceManager::ForceManager(this_00,info);
  OpenMD::Velocitizer::removeComDrift(this);
  (*this_00->_vptr_ForceManager[2])(this_00);
  local_158 = OpenMD::Thermo::getPotential(&local_160);
  local_168 = OpenMD::Thermo::getKinetic(&local_160);
  (*info->sman_->_vptr_SnapshotManager[2])();
  this_01 = (DumpWriter *)operator_new(0x60);
  OpenMD::DumpWriter::DumpWriter(this_01,info,&local_150);
  if (local_e8.temperature_given != 0) {
    if (local_e8.temperature_arg < 0.0) {
      builtin_strncpy(painCave.errMsg,"Temperatures must be positive numbers.",0x27);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    OpenMD::Velocitizer::randomize(this,local_e8.temperature_arg);
  }
  if (local_e8.chargetemperature_given != 0) {
    if (local_e8.chargetemperature_arg < 0.0) {
      builtin_strncpy(painCave.errMsg,"Temperatures must be positive numbers.",0x27);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    OpenMD::Velocitizer::randomizeChargeVelocity(this,local_e8.chargetemperature_arg);
  }
  if (local_e8.energy_given != 0) {
    if (local_158 <= local_e8.energy_arg) {
      if (local_168 < 1e-06) {
        OpenMD::Velocitizer::randomize(this,10.0);
        local_168 = OpenMD::Thermo::getKinetic(&local_160);
      }
      dVar2 = (local_e8.energy_arg - local_158) / local_168;
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      OpenMD::Velocitizer::scale(this,dVar2);
    }
    else {
      builtin_strncpy(painCave.errMsg,"Energy must be larger than current potential energy.",0x35);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  OpenMD::DumpWriter::writeDump(this_01);
  OpenMD::DumpWriter::~DumpWriter(this_01);
  operator_delete(this_01,0x60);
  snprintf(painCave.errMsg,2000,"A new OpenMD file called \"%s\" has been generated.\n",
           local_150._M_dataplus._M_p);
  painCave.isFatal = 0;
  painCave.severity = 3;
  simError();
  (*this->_vptr_Velocitizer[1])(this);
  local_110._vptr_SimCreator = (_func_int **)&PTR__SimCreator_002a7fe0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.mdFileName_._M_dataplus._M_p != paVar1) {
    operator_delete(local_110.mdFileName_._M_dataplus._M_p,
                    CONCAT71(local_110.mdFileName_.field_2._M_allocated_capacity._1_7_,
                             local_110.mdFileName_.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,
                    CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                             local_150.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,
                    CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                             local_130.field_2._M_local_buf[0]) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  gengetopt_args_info args_info;
  std::string inputFileName;
  std::string outputFileName;

  // parse command line arguments
  if (cmdline_parser(argc, argv, &args_info) != 0) {
    cmdline_parser_print_help();
    exit(1);
  }

  // get input file name
  if (args_info.input_given) {
    inputFileName = args_info.input_arg;
  } else {
    if (args_info.inputs_num) {
      inputFileName = args_info.inputs[0];
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "No input file name was specified on the command line");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
  }

  // get output file name
  outputFileName = args_info.output_arg;

  if (!outputFileName.compare(inputFileName)) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Input and Output File names should be different!");
    painCave.severity = OPENMD_ERROR;
    painCave.isFatal  = 1;
    simError();
  }

  // Parse the input file, set up the system, and read the last frame:
  SimCreator creator;
  SimInfo* info = creator.createSim(inputFileName, true);

  // Important utility classes for computing system properties:
  Thermo thermo(info);

  std::unique_ptr<Velocitizer> veloSet {std::make_unique<Velocitizer>(info)};

  ForceManager* forceMan = new ForceManager(info);

  // Just in case we were passed a system that is on the move:
  veloSet->removeComDrift();
  forceMan->calcForces();

  RealType instPE = thermo.getPotential();
  RealType instKE = thermo.getKinetic();

  // Now that we have the information from the current frame, advance
  // the snapshot to make a modified frame:
  info->getSnapshotManager()->advance();

  // Create DumpWriter to hold the modified frame:
  DumpWriter* writer = new DumpWriter(info, outputFileName);
  if (writer == NULL) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "error in creating DumpWriter");
    painCave.severity = OPENMD_ERROR;
    painCave.isFatal  = 1;
    simError();
  }

  // If resampling temperature, we call the randomizer method:
  if (args_info.temperature_given) {
    RealType temperature = args_info.temperature_arg;

    if (temperature < 0.0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Temperatures must be positive numbers.");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    veloSet->randomize(temperature);
  }

  // If resampling charge temperature, we call the randomizeChargeVelocity
  // method
  if (args_info.chargetemperature_given) {
    RealType charge_temperature = args_info.chargetemperature_arg;

    if (charge_temperature < 0.0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Temperatures must be positive numbers.");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    veloSet->randomizeChargeVelocity(charge_temperature);
  }

  // If scaling total energy, scale only the kinetic:
  if (args_info.energy_given) {
    RealType energy  = args_info.energy_arg;
    RealType epsilon = 1e-6;
    RealType lambda  = 0.0;

    if (energy < instPE) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Energy must be larger than current potential energy.");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    } else {
      if (instKE >= epsilon) {
        lambda = sqrt((energy - instPE) / instKE);
        veloSet->scale(lambda);
      }
      // If the current kinetic energy is close to zero, we will
      // sample velocities from a 10K distribution and then
      // subsequently scale from 10K to the desired energy.
      else {
        veloSet->randomize(10.0);
        instKE = thermo.getKinetic();
        lambda = sqrt((energy - instPE) / instKE);
        veloSet->scale(lambda);
      }
    }
  }

  writer->writeDump();
  // deleting the writer will put the closing at the end of the dump file.
  delete writer;

  snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
           "A new OpenMD file called \"%s\" has been generated.\n",
           outputFileName.c_str());
  painCave.isFatal  = 0;
  painCave.severity = OPENMD_INFO;
  simError();
  return 0;
}